

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void __thiscall
cxxopts::OptionSpecException::OptionSpecException(OptionSpecException *this,string *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *local_38;
  size_type local_30;
  char local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  pcVar2 = (message->_M_dataplus)._M_p;
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar2,pcVar2 + message->_M_string_length);
  *(undefined ***)&this->super_OptionException = &PTR__OptionException_00130528;
  paVar1 = &(this->super_OptionException).m_message.field_2;
  (this->super_OptionException).m_message._M_dataplus._M_p = (pointer)paVar1;
  if (local_38 == &local_28) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_27,local_28);
    *(undefined8 *)((long)&(this->super_OptionException).m_message.field_2 + 8) = uStack_20;
  }
  else {
    (this->super_OptionException).m_message._M_dataplus._M_p = local_38;
    (this->super_OptionException).m_message.field_2._M_allocated_capacity =
         CONCAT71(uStack_27,local_28);
  }
  (this->super_OptionException).m_message._M_string_length = local_30;
  *(undefined ***)&this->super_OptionException = &PTR__OptionException_00130500;
  return;
}

Assistant:

explicit OptionSpecException(const std::string& message)
    : OptionException(message)
    {
    }